

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

StringOrCallback * __thiscall
google::protobuf::io::Printer::ValueImpl<true>::ToStringOrCallback<std::function<void()>&,void>
          (variant<std::__cxx11::string,std::function<bool()>> *__return_storage_ptr__,
          undefined8 param_2,function<void_()> *cb)

{
  anon_class_40_2_a93b23f4 aStack_58;
  function<bool_()> local_30;
  
  std::function<void_()>::function(&aStack_58.cb,cb);
  aStack_58.is_called = false;
  std::function<bool()>::
  function<google::protobuf::io::Printer::ValueImpl<true>::ToStringOrCallback<std::function<void()>&,void>(std::function<void()>&,google::protobuf::io::Printer::ValueImpl<true>::Rank2)::_lambda()_1_,void>
            ((function<bool()> *)&local_30,&aStack_58);
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (__return_storage_ptr__,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)&aStack_58);
  return (StringOrCallback *)__return_storage_ptr__;
}

Assistant:

auto Printer::ValueImpl<owned>::ToStringOrCallback(Cb&& cb, Rank2)
    -> StringOrCallback {
  return Callback(
      [cb = std::forward<Cb>(cb), is_called = false]() mutable -> bool {
        if (is_called) {
          // Catch whether or not this function is being called recursively.
          return false;
        }
        is_called = true;
        cb();
        is_called = false;
        return true;
      });
}